

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

int __thiscall
google::protobuf::compiler::CommandLineInterface::Run
          (CommandLineInterface *this,int argc,char **argv)

{
  ErrorFormat format;
  int iVar1;
  bool bVar2;
  ParseArgumentStatus PVar3;
  int iVar4;
  size_type sVar5;
  reference this_00;
  MergedDescriptorDatabase *this_01;
  DiskSourceTree *this_02;
  pointer pDVar6;
  pointer pMVar7;
  ErrorPrinter *pEVar8;
  SourceTreeDescriptorDatabase *this_03;
  pointer pSVar9;
  pointer pEVar10;
  DescriptorPool *pDVar11;
  pointer this_04;
  ErrorCollector *error_collector_00;
  pointer pDVar12;
  ulong uVar13;
  reference pvVar14;
  unique_ptr *this_05;
  GeneratorContextImpl *this_06;
  pointer generator_context;
  uint32_t *puVar15;
  Arena *pAVar16;
  DescriptorProto *this_07;
  FileDescriptor *pFVar17;
  reference ppFVar18;
  Descriptor *descriptor;
  LogMessage *pLVar19;
  byte local_52a;
  ErrorCollector *local_490;
  LogFinisher local_451;
  LogMessage local_450;
  int local_414;
  value_type pFStack_410;
  int j;
  FileDescriptor *fd;
  int i_1;
  undefined1 local_3c8 [8];
  FileDescriptorProto file;
  DescriptorPool pool;
  LogMessage local_288;
  StringPiece local_250;
  StringPiece local_240;
  StringPiece local_230;
  StringPiece local_220;
  pointer local_210;
  GeneratorContextImpl *directory;
  string *location;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>
  *pair;
  iterator __end2;
  iterator __begin2;
  GeneratorContextMap *__range2;
  mapped_type *generator;
  StringPiece local_1c8;
  StringPiece local_1b8;
  StringPiece local_1a8;
  StringPiece local_198;
  StringPiece local_188;
  undefined1 local_178 [8];
  string output_location;
  undefined1 local_150 [4];
  int i;
  GeneratorContextMap output_directories;
  unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
  *db;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
  *__range3_1;
  vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
  raw_databases_per_descriptor_set;
  value_type local_c8;
  unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
  database_for_descriptor_set;
  string *name;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  unique_ptr<google::protobuf::compiler::SourceTreeDescriptorDatabase,_std::default_delete<google::protobuf::compiler::SourceTreeDescriptorDatabase>_>
  source_tree_database;
  unique_ptr<google::protobuf::MergedDescriptorDatabase,_std::default_delete<google::protobuf::MergedDescriptorDatabase>_>
  descriptor_set_in_database;
  vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
  databases_per_descriptor_set;
  unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
  descriptor_pool;
  unique_ptr<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
  error_collector;
  unique_ptr<google::protobuf::compiler::DiskSourceTree,_std::default_delete<google::protobuf::compiler::DiskSourceTree>_>
  disk_source_tree;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  parsed_files;
  char **argv_local;
  int argc_local;
  CommandLineInterface *this_local;
  
  Clear(this);
  PVar3 = ParseArguments(this,argc,argv);
  if (PVar3 != PARSE_ARGUMENT_DONE_AND_CONTINUE) {
    if (PVar3 == PARSE_ARGUMENT_DONE_AND_EXIT) {
      return 0;
    }
    if (PVar3 == PARSE_ARGUMENT_FAIL) {
      return 1;
    }
  }
  std::
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            *)&disk_source_tree);
  std::
  unique_ptr<google::protobuf::compiler::DiskSourceTree,std::default_delete<google::protobuf::compiler::DiskSourceTree>>
  ::unique_ptr<std::default_delete<google::protobuf::compiler::DiskSourceTree>,void>
            ((unique_ptr<google::protobuf::compiler::DiskSourceTree,std::default_delete<google::protobuf::compiler::DiskSourceTree>>
              *)&error_collector);
  std::
  unique_ptr<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>>
  ::
  unique_ptr<std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>,void>
            ((unique_ptr<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>>
              *)&descriptor_pool);
  std::
  unique_ptr<google::protobuf::DescriptorPool,std::default_delete<google::protobuf::DescriptorPool>>
  ::unique_ptr<std::default_delete<google::protobuf::DescriptorPool>,void>
            ((unique_ptr<google::protobuf::DescriptorPool,std::default_delete<google::protobuf::DescriptorPool>>
              *)&databases_per_descriptor_set.
                 super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
  ::vector((vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
            *)&descriptor_set_in_database);
  std::
  unique_ptr<google::protobuf::MergedDescriptorDatabase,std::default_delete<google::protobuf::MergedDescriptorDatabase>>
  ::unique_ptr<std::default_delete<google::protobuf::MergedDescriptorDatabase>,void>
            ((unique_ptr<google::protobuf::MergedDescriptorDatabase,std::default_delete<google::protobuf::MergedDescriptorDatabase>>
              *)&source_tree_database);
  std::
  unique_ptr<google::protobuf::compiler::SourceTreeDescriptorDatabase,std::default_delete<google::protobuf::compiler::SourceTreeDescriptorDatabase>>
  ::unique_ptr<std::default_delete<google::protobuf::compiler::SourceTreeDescriptorDatabase>,void>
            ((unique_ptr<google::protobuf::compiler::SourceTreeDescriptorDatabase,std::default_delete<google::protobuf::compiler::SourceTreeDescriptorDatabase>>
              *)&__range3);
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->descriptor_set_in_names_);
  if (!bVar2) {
    __end3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->descriptor_set_in_names_);
    name = (string *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->descriptor_set_in_names_);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&name), bVar2) {
      database_for_descriptor_set._M_t.
      super___uniq_ptr_impl<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
      ._M_t.
      super__Tuple_impl<0UL,_google::protobuf::SimpleDescriptorDatabase_*,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
      .super__Head_base<0UL,_google::protobuf::SimpleDescriptorDatabase_*,_false>._M_head_impl =
           (__uniq_ptr_data<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>,_true,_true>
            )__gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end3);
      anon_unknown_4::PopulateSingleSimpleDescriptorDatabase
                ((anon_unknown_4 *)&local_c8,
                 (string *)
                 database_for_descriptor_set._M_t.
                 super___uniq_ptr_impl<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::SimpleDescriptorDatabase_*,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
                 .super__Head_base<0UL,_google::protobuf::SimpleDescriptorDatabase_*,_false>.
                 _M_head_impl);
      bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_c8);
      if (bVar2) {
        std::
        vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
        ::push_back((vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
                     *)&descriptor_set_in_database,&local_c8);
      }
      else {
        this_local._4_4_ = 1;
      }
      raw_databases_per_descriptor_set.
      super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._1_3_ = 0;
      raw_databases_per_descriptor_set.
      super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = !bVar2;
      std::
      unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
      ::~unique_ptr(&local_c8);
      if ((uint)raw_databases_per_descriptor_set.
                super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage != 0) goto LAB_004389c9;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end3);
    }
    std::
    vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
    ::vector((vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
              *)&__range3_1);
    sVar5 = std::
            vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
            ::size((vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
                    *)&descriptor_set_in_database);
    std::
    vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
    ::reserve((vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
               *)&__range3_1,sVar5);
    __end3_1 = std::
               vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
               ::begin((vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
                        *)&descriptor_set_in_database);
    db = (unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
          *)std::
            vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
            ::end((vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
                   *)&descriptor_set_in_database);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3_1,
                              (__normal_iterator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_*,_std::vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>_>
                               *)&db), bVar2) {
      this_00 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_*,_std::vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>_>
                ::operator*(&__end3_1);
      output_directories._M_h._M_single_bucket =
           (__node_base_ptr)
           std::
           unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
           ::get(this_00);
      std::
      vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
      ::push_back((vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                   *)&__range3_1,(value_type *)&output_directories._M_h._M_single_bucket);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_*,_std::vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>_>
      ::operator++(&__end3_1);
    }
    this_01 = (MergedDescriptorDatabase *)operator_new(0x20);
    MergedDescriptorDatabase::MergedDescriptorDatabase
              (this_01,(vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                        *)&__range3_1);
    std::
    unique_ptr<google::protobuf::MergedDescriptorDatabase,_std::default_delete<google::protobuf::MergedDescriptorDatabase>_>
    ::reset((unique_ptr<google::protobuf::MergedDescriptorDatabase,_std::default_delete<google::protobuf::MergedDescriptorDatabase>_>
             *)&source_tree_database,this_01);
    std::
    vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
    ::~vector((vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
               *)&__range3_1);
  }
  bVar2 = std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty(&this->proto_path_);
  if (bVar2) {
    pMVar7 = std::
             unique_ptr<google::protobuf::MergedDescriptorDatabase,_std::default_delete<google::protobuf::MergedDescriptorDatabase>_>
             ::get((unique_ptr<google::protobuf::MergedDescriptorDatabase,_std::default_delete<google::protobuf::MergedDescriptorDatabase>_>
                    *)&source_tree_database);
    bVar2 = VerifyInputFilesInDescriptors(this,&pMVar7->super_DescriptorDatabase);
    if (!bVar2) {
      this_local._4_4_ = 1;
      raw_databases_per_descriptor_set.
      super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      goto LAB_004389c9;
    }
    pEVar8 = (ErrorPrinter *)operator_new(0x30);
    ErrorPrinter::ErrorPrinter(pEVar8,this->error_format_,(DiskSourceTree *)0x0);
    std::
    unique_ptr<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
    ::reset((unique_ptr<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
             *)&descriptor_pool,pEVar8);
    pDVar11 = (DescriptorPool *)operator_new(0x60);
    pMVar7 = std::
             unique_ptr<google::protobuf::MergedDescriptorDatabase,_std::default_delete<google::protobuf::MergedDescriptorDatabase>_>
             ::get((unique_ptr<google::protobuf::MergedDescriptorDatabase,_std::default_delete<google::protobuf::MergedDescriptorDatabase>_>
                    *)&source_tree_database);
    pEVar10 = std::
              unique_ptr<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
              ::get((unique_ptr<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
                     *)&descriptor_pool);
    local_490 = (ErrorCollector *)0x0;
    if (pEVar10 != (pointer)0x0) {
      local_490 = &pEVar10->super_ErrorCollector;
    }
    DescriptorPool::DescriptorPool(pDVar11,&pMVar7->super_DescriptorDatabase,local_490);
    std::
    unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
    ::reset((unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
             *)&databases_per_descriptor_set.
                super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,pDVar11);
  }
  else {
    this_02 = (DiskSourceTree *)operator_new(0x40);
    DiskSourceTree::DiskSourceTree(this_02);
    std::
    unique_ptr<google::protobuf::compiler::DiskSourceTree,_std::default_delete<google::protobuf::compiler::DiskSourceTree>_>
    ::reset((unique_ptr<google::protobuf::compiler::DiskSourceTree,_std::default_delete<google::protobuf::compiler::DiskSourceTree>_>
             *)&error_collector,this_02);
    pDVar6 = std::
             unique_ptr<google::protobuf::compiler::DiskSourceTree,_std::default_delete<google::protobuf::compiler::DiskSourceTree>_>
             ::get((unique_ptr<google::protobuf::compiler::DiskSourceTree,_std::default_delete<google::protobuf::compiler::DiskSourceTree>_>
                    *)&error_collector);
    pMVar7 = std::
             unique_ptr<google::protobuf::MergedDescriptorDatabase,_std::default_delete<google::protobuf::MergedDescriptorDatabase>_>
             ::get((unique_ptr<google::protobuf::MergedDescriptorDatabase,_std::default_delete<google::protobuf::MergedDescriptorDatabase>_>
                    *)&source_tree_database);
    bVar2 = InitializeDiskSourceTree(this,pDVar6,&pMVar7->super_DescriptorDatabase);
    if (!bVar2) {
      this_local._4_4_ = 1;
      raw_databases_per_descriptor_set.
      super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      goto LAB_004389c9;
    }
    pEVar8 = (ErrorPrinter *)operator_new(0x30);
    format = this->error_format_;
    pDVar6 = std::
             unique_ptr<google::protobuf::compiler::DiskSourceTree,_std::default_delete<google::protobuf::compiler::DiskSourceTree>_>
             ::get((unique_ptr<google::protobuf::compiler::DiskSourceTree,_std::default_delete<google::protobuf::compiler::DiskSourceTree>_>
                    *)&error_collector);
    ErrorPrinter::ErrorPrinter(pEVar8,format,pDVar6);
    std::
    unique_ptr<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
    ::reset((unique_ptr<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
             *)&descriptor_pool,pEVar8);
    this_03 = (SourceTreeDescriptorDatabase *)operator_new(0x98);
    pDVar6 = std::
             unique_ptr<google::protobuf::compiler::DiskSourceTree,_std::default_delete<google::protobuf::compiler::DiskSourceTree>_>
             ::get((unique_ptr<google::protobuf::compiler::DiskSourceTree,_std::default_delete<google::protobuf::compiler::DiskSourceTree>_>
                    *)&error_collector);
    pMVar7 = std::
             unique_ptr<google::protobuf::MergedDescriptorDatabase,_std::default_delete<google::protobuf::MergedDescriptorDatabase>_>
             ::get((unique_ptr<google::protobuf::MergedDescriptorDatabase,_std::default_delete<google::protobuf::MergedDescriptorDatabase>_>
                    *)&source_tree_database);
    SourceTreeDescriptorDatabase::SourceTreeDescriptorDatabase
              (this_03,&pDVar6->super_SourceTree,&pMVar7->super_DescriptorDatabase);
    std::
    unique_ptr<google::protobuf::compiler::SourceTreeDescriptorDatabase,_std::default_delete<google::protobuf::compiler::SourceTreeDescriptorDatabase>_>
    ::reset((unique_ptr<google::protobuf::compiler::SourceTreeDescriptorDatabase,_std::default_delete<google::protobuf::compiler::SourceTreeDescriptorDatabase>_>
             *)&__range3,this_03);
    pSVar9 = std::
             unique_ptr<google::protobuf::compiler::SourceTreeDescriptorDatabase,_std::default_delete<google::protobuf::compiler::SourceTreeDescriptorDatabase>_>
             ::operator->((unique_ptr<google::protobuf::compiler::SourceTreeDescriptorDatabase,_std::default_delete<google::protobuf::compiler::SourceTreeDescriptorDatabase>_>
                           *)&__range3);
    pEVar10 = std::
              unique_ptr<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
              ::get((unique_ptr<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
                     *)&descriptor_pool);
    SourceTreeDescriptorDatabase::RecordErrorsTo(pSVar9,&pEVar10->super_MultiFileErrorCollector);
    pDVar11 = (DescriptorPool *)operator_new(0x60);
    pSVar9 = std::
             unique_ptr<google::protobuf::compiler::SourceTreeDescriptorDatabase,_std::default_delete<google::protobuf::compiler::SourceTreeDescriptorDatabase>_>
             ::get((unique_ptr<google::protobuf::compiler::SourceTreeDescriptorDatabase,_std::default_delete<google::protobuf::compiler::SourceTreeDescriptorDatabase>_>
                    *)&__range3);
    this_04 = std::
              unique_ptr<google::protobuf::compiler::SourceTreeDescriptorDatabase,_std::default_delete<google::protobuf::compiler::SourceTreeDescriptorDatabase>_>
              ::operator->((unique_ptr<google::protobuf::compiler::SourceTreeDescriptorDatabase,_std::default_delete<google::protobuf::compiler::SourceTreeDescriptorDatabase>_>
                            *)&__range3);
    error_collector_00 = SourceTreeDescriptorDatabase::GetValidationErrorCollector(this_04);
    DescriptorPool::DescriptorPool(pDVar11,&pSVar9->super_DescriptorDatabase,error_collector_00);
    std::
    unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
    ::reset((unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
             *)&databases_per_descriptor_set.
                super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,pDVar11);
  }
  pDVar12 = std::
            unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
            ::operator->((unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
                          *)&databases_per_descriptor_set.
                             super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  DescriptorPool::EnforceWeakDependencies(pDVar12,true);
  pDVar12 = std::
            unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
            ::get((unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
                   *)&databases_per_descriptor_set.
                      super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pDVar6 = std::
           unique_ptr<google::protobuf::compiler::DiskSourceTree,_std::default_delete<google::protobuf::compiler::DiskSourceTree>_>
           ::get((unique_ptr<google::protobuf::compiler::DiskSourceTree,_std::default_delete<google::protobuf::compiler::DiskSourceTree>_>
                  *)&error_collector);
  bVar2 = ParseInputFiles(this,pDVar12,pDVar6,
                          (vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                           *)&disk_source_tree);
  if (!bVar2) {
    this_local._4_4_ = 1;
    raw_databases_per_descriptor_set.
    super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    goto LAB_004389c9;
  }
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
                   *)local_150);
  if (this->mode_ == MODE_COMPILE) {
    for (output_location.field_2._12_4_ = 0; uVar13 = (ulong)(int)output_location.field_2._12_4_,
        sVar5 = std::
                vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                ::size(&this->output_directives_), uVar13 < sVar5;
        output_location.field_2._12_4_ = output_location.field_2._12_4_ + 1) {
      pvVar14 = std::
                vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                ::operator[](&this->output_directives_,(long)(int)output_location.field_2._12_4_);
      std::__cxx11::string::string((string *)local_178,(string *)&pvVar14->output_location);
      stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
                (&local_188,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178);
      stringpiece_internal::StringPiece::StringPiece(&local_198,".zip");
      bVar2 = HasSuffixString(local_188,local_198);
      local_52a = 0;
      if (!bVar2) {
        stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
                  (&local_1a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178);
        stringpiece_internal::StringPiece::StringPiece(&local_1b8,".jar");
        bVar2 = HasSuffixString(local_1a8,local_1b8);
        local_52a = 0;
        if (!bVar2) {
          stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
                    (&local_1c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178)
          ;
          stringpiece_internal::StringPiece::StringPiece((StringPiece *)&generator,".srcjar");
          bVar2 = HasSuffixString(local_1c8,_generator);
          local_52a = bVar2 ^ 0xff;
        }
      }
      if ((local_52a & 1) != 0) {
        anon_unknown_4::AddTrailingSlash((string *)local_178);
      }
      this_05 = (unique_ptr *)
                std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
                ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
                              *)local_150,(key_type *)local_178);
      bVar2 = std::unique_ptr::operator_cast_to_bool(this_05);
      if (!bVar2) {
        this_06 = (GeneratorContextImpl *)operator_new(0x48);
        GeneratorContextImpl::GeneratorContextImpl
                  (this_06,(vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                            *)&disk_source_tree);
        std::
        unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
        ::reset((unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
                 *)this_05,this_06);
      }
      pvVar14 = std::
                vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                ::operator[](&this->output_directives_,(long)(int)output_location.field_2._12_4_);
      generator_context =
           std::
           unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
           ::get((unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
                  *)this_05);
      bVar2 = GenerateOutput(this,(vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                   *)&disk_source_tree,pvVar14,
                             &generator_context->super_GeneratorContext);
      if (!bVar2) {
        this_local._4_4_ = 1;
      }
      raw_databases_per_descriptor_set.
      super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._1_3_ = 0;
      raw_databases_per_descriptor_set.
      super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = !bVar2;
      std::__cxx11::string::~string((string *)local_178);
      if ((uint)raw_databases_per_descriptor_set.
                super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage != 0) goto LAB_004389ad;
    }
  }
  __end2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
           ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
                    *)local_150);
  pair = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>
          *)std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
            ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
                   *)local_150);
  while (bVar2 = std::__detail::operator!=
                           (&__end2.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_true>
                            ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_true>
                              *)&pair), bVar2) {
    directory = (GeneratorContextImpl *)
                std::__detail::
                _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_false,_true>
                ::operator*(&__end2);
    location = (string *)directory;
    local_210 = std::
                unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
                ::get((unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
                       *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
                           *)&(directory->files_)._M_t._M_impl.super__Rb_tree_header + 1));
    stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
              (&local_220,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)directory);
    stringpiece_internal::StringPiece::StringPiece(&local_230,"/");
    bVar2 = HasSuffixString(local_220,local_230);
    if (bVar2) {
      bVar2 = GeneratorContextImpl::WriteAllToDisk(local_210,(string *)directory);
      if (!bVar2) {
        this_local._4_4_ = 1;
        raw_databases_per_descriptor_set.
        super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
        goto LAB_004389ad;
      }
    }
    else {
      stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
                (&local_240,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)directory);
      stringpiece_internal::StringPiece::StringPiece(&local_250,".jar");
      bVar2 = HasSuffixString(local_240,local_250);
      if (bVar2) {
        GeneratorContextImpl::AddJarManifest(local_210);
      }
      bVar2 = GeneratorContextImpl::WriteAllToZip(local_210,(string *)directory);
      if (!bVar2) {
        this_local._4_4_ = 1;
        raw_databases_per_descriptor_set.
        super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
        goto LAB_004389ad;
      }
    }
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_false,_true>
    ::operator++(&__end2);
  }
  uVar13 = std::__cxx11::string::empty();
  if ((uVar13 & 1) == 0) {
    pDVar6 = std::
             unique_ptr<google::protobuf::compiler::DiskSourceTree,_std::default_delete<google::protobuf::compiler::DiskSourceTree>_>
             ::get((unique_ptr<google::protobuf::compiler::DiskSourceTree,_std::default_delete<google::protobuf::compiler::DiskSourceTree>_>
                    *)&error_collector);
    pool.unused_import_track_files_._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
    if (pDVar6 == (pointer)0x0) {
      internal::LogMessage::LogMessage
                (&local_288,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                 ,1099);
      pool.unused_import_track_files_._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
      pLVar19 = internal::LogMessage::operator<<
                          (&local_288,"CHECK failed: disk_source_tree.get(): ");
      internal::LogFinisher::operator=
                ((LogFinisher *)
                 ((long)&pool.unused_import_track_files_._M_t._M_impl.super__Rb_tree_header.
                         _M_node_count + 6),pLVar19);
    }
    if ((pool.unused_import_track_files_._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1)
        != 0) {
      internal::LogMessage::~LogMessage(&local_288);
    }
    pDVar6 = std::
             unique_ptr<google::protobuf::compiler::DiskSourceTree,_std::default_delete<google::protobuf::compiler::DiskSourceTree>_>
             ::get((unique_ptr<google::protobuf::compiler::DiskSourceTree,_std::default_delete<google::protobuf::compiler::DiskSourceTree>_>
                    *)&error_collector);
    bVar2 = GenerateDependencyManifestFile
                      (this,(vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                             *)&disk_source_tree,(GeneratorContextMap *)local_150,pDVar6);
    if (bVar2) goto LAB_004383cb;
    this_local._4_4_ = 1;
    raw_databases_per_descriptor_set.
    super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  }
  else {
LAB_004383cb:
    uVar13 = std::__cxx11::string::empty();
    if (((uVar13 & 1) != 0) ||
       (bVar2 = WriteDescriptorSet(this,(vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                         *)&disk_source_tree), bVar2)) {
      if ((this->mode_ == MODE_ENCODE) || (this->mode_ == MODE_DECODE)) {
        uVar13 = std::__cxx11::string::empty();
        if ((uVar13 & 1) == 0) {
          pDVar12 = std::
                    unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
                    ::get((unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
                           *)&databases_per_descriptor_set.
                              super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          bVar2 = EncodeOrDecode(this,pDVar12);
          if (bVar2) goto LAB_00438773;
          this_local._4_4_ = 1;
          raw_databases_per_descriptor_set.
          super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
        }
        else {
          DescriptorPool::DescriptorPool((DescriptorPool *)&file.source_code_info_);
          FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_3c8);
          puVar15 = internal::HasBits<1UL>::operator[]
                              ((HasBits<1UL> *)
                               &file.super_Message.super_MessageLite._internal_metadata_,0);
          *(byte *)puVar15 = (byte)*puVar15 | 1;
          pAVar16 = MessageLite::GetArenaForAllocation((MessageLite *)local_3c8);
          internal::ArenaStringPtr::Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
                    ((ArenaStringPtr *)&file.weak_dependency_.arena_or_elements_,
                     "empty_message.proto",pAVar16);
          this_07 = FileDescriptorProto::add_message_type((FileDescriptorProto *)local_3c8);
          puVar15 = internal::HasBits<1UL>::operator[](&this_07->_has_bits_,0);
          *(byte *)puVar15 = (byte)*puVar15 | 1;
          pAVar16 = MessageLite::GetArenaForAllocation((MessageLite *)this_07);
          internal::ArenaStringPtr::Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
                    (&this_07->name_,"EmptyMessage",pAVar16);
          fd._7_1_ = 0;
          pFVar17 = DescriptorPool::BuildFile
                              ((DescriptorPool *)&file.source_code_info_,
                               (FileDescriptorProto *)local_3c8);
          if (pFVar17 == (FileDescriptor *)0x0) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)&i_1,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                       ,0x45f);
            fd._7_1_ = 1;
            pLVar19 = internal::LogMessage::operator<<
                                ((LogMessage *)&i_1,"CHECK failed: pool.BuildFile(file) != NULL: ");
            internal::LogFinisher::operator=((LogFinisher *)((long)&fd + 6),pLVar19);
          }
          if ((fd._7_1_ & 1) != 0) {
            internal::LogMessage::~LogMessage((LogMessage *)&i_1);
          }
          std::__cxx11::string::operator=((string *)&this->codec_type_,"EmptyMessage");
          bVar2 = EncodeOrDecode(this,(DescriptorPool *)&file.source_code_info_);
          if (!bVar2) {
            this_local._4_4_ = 1;
          }
          raw_databases_per_descriptor_set.
          super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._1_3_ = 0;
          raw_databases_per_descriptor_set.
          super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = !bVar2;
          FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_3c8);
          DescriptorPool::~DescriptorPool((DescriptorPool *)&file.source_code_info_);
          if ((uint)raw_databases_per_descriptor_set.
                    super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage == 0) goto LAB_00438773;
        }
      }
      else {
LAB_00438773:
        pEVar10 = std::
                  unique_ptr<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
                  ::operator->((unique_ptr<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
                                *)&descriptor_pool);
        bVar2 = ErrorPrinter::FoundErrors(pEVar10);
        if (bVar2) {
LAB_004387cd:
          this_local._4_4_ = 1;
          raw_databases_per_descriptor_set.
          super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
        }
        else {
          if ((this->fatal_warnings_ & 1U) != 0) {
            pEVar10 = std::
                      unique_ptr<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
                      ::operator->((unique_ptr<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
                                    *)&descriptor_pool);
            bVar2 = ErrorPrinter::FoundWarnings(pEVar10);
            if (bVar2) goto LAB_004387cd;
          }
          if (this->mode_ == MODE_PRINT) {
            if (this->print_mode_ == PRINT_NONE) {
              internal::LogMessage::LogMessage
                        (&local_450,LOGLEVEL_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                         ,0x47b);
              pLVar19 = internal::LogMessage::operator<<
                                  (&local_450,
                                   "If the code reaches here, it usually means a bug of flag parsing in the CommandLineInterface."
                                  );
              internal::LogFinisher::operator=(&local_451,pLVar19);
              internal::LogMessage::~LogMessage(&local_450);
              this_local._4_4_ = 1;
              raw_databases_per_descriptor_set.
              super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
              goto LAB_004389ad;
            }
            if (this->print_mode_ == PRINT_FREE_FIELDS) {
              for (fd._0_4_ = 0; uVar13 = (ulong)(int)fd,
                  sVar5 = std::
                          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                          ::size((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                  *)&disk_source_tree), uVar13 < sVar5; fd._0_4_ = (int)fd + 1) {
                ppFVar18 = std::
                           vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                           ::operator[]((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                         *)&disk_source_tree,(long)(int)fd);
                pFStack_410 = *ppFVar18;
                for (local_414 = 0; iVar1 = local_414,
                    iVar4 = FileDescriptor::message_type_count(pFStack_410), iVar1 < iVar4;
                    local_414 = local_414 + 1) {
                  descriptor = FileDescriptor::message_type(pFStack_410,local_414);
                  PrintFreeFieldNumbers(this,descriptor);
                }
              }
            }
          }
          this_local._4_4_ = 0;
          raw_databases_per_descriptor_set.
          super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
        }
      }
    }
    else {
      this_local._4_4_ = 1;
      raw_databases_per_descriptor_set.
      super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    }
  }
LAB_004389ad:
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
                    *)local_150);
LAB_004389c9:
  std::
  unique_ptr<google::protobuf::compiler::SourceTreeDescriptorDatabase,_std::default_delete<google::protobuf::compiler::SourceTreeDescriptorDatabase>_>
  ::~unique_ptr((unique_ptr<google::protobuf::compiler::SourceTreeDescriptorDatabase,_std::default_delete<google::protobuf::compiler::SourceTreeDescriptorDatabase>_>
                 *)&__range3);
  std::
  unique_ptr<google::protobuf::MergedDescriptorDatabase,_std::default_delete<google::protobuf::MergedDescriptorDatabase>_>
  ::~unique_ptr((unique_ptr<google::protobuf::MergedDescriptorDatabase,_std::default_delete<google::protobuf::MergedDescriptorDatabase>_>
                 *)&source_tree_database);
  std::
  vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
  ::~vector((vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
             *)&descriptor_set_in_database);
  std::
  unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
  ::~unique_ptr((unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
                 *)&databases_per_descriptor_set.
                    super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  unique_ptr<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
  ::~unique_ptr((unique_ptr<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
                 *)&descriptor_pool);
  std::
  unique_ptr<google::protobuf::compiler::DiskSourceTree,_std::default_delete<google::protobuf::compiler::DiskSourceTree>_>
  ::~unique_ptr((unique_ptr<google::protobuf::compiler::DiskSourceTree,_std::default_delete<google::protobuf::compiler::DiskSourceTree>_>
                 *)&error_collector);
  std::
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::~vector((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             *)&disk_source_tree);
  return this_local._4_4_;
}

Assistant:

int CommandLineInterface::Run(int argc, const char* const argv[]) {
  Clear();
  switch (ParseArguments(argc, argv)) {
    case PARSE_ARGUMENT_DONE_AND_EXIT:
      return 0;
    case PARSE_ARGUMENT_FAIL:
      return 1;
    case PARSE_ARGUMENT_DONE_AND_CONTINUE:
      break;
  }

  std::vector<const FileDescriptor*> parsed_files;
  std::unique_ptr<DiskSourceTree> disk_source_tree;
  std::unique_ptr<ErrorPrinter> error_collector;
  std::unique_ptr<DescriptorPool> descriptor_pool;

  // The SimpleDescriptorDatabases here are the constituents of the
  // MergedDescriptorDatabase descriptor_set_in_database, so this vector is for
  // managing their lifetimes. Its scope should match descriptor_set_in_database
  std::vector<std::unique_ptr<SimpleDescriptorDatabase>>
      databases_per_descriptor_set;
  std::unique_ptr<MergedDescriptorDatabase> descriptor_set_in_database;

  std::unique_ptr<SourceTreeDescriptorDatabase> source_tree_database;

  // Any --descriptor_set_in FileDescriptorSet objects will be used as a
  // fallback to input_files on command line, so create that db first.
  if (!descriptor_set_in_names_.empty()) {
    for (const std::string& name : descriptor_set_in_names_) {
      std::unique_ptr<SimpleDescriptorDatabase> database_for_descriptor_set =
          PopulateSingleSimpleDescriptorDatabase(name);
      if (!database_for_descriptor_set) {
        return EXIT_FAILURE;
      }
      databases_per_descriptor_set.push_back(
          std::move(database_for_descriptor_set));
    }

    std::vector<DescriptorDatabase*> raw_databases_per_descriptor_set;
    raw_databases_per_descriptor_set.reserve(
        databases_per_descriptor_set.size());
    for (const std::unique_ptr<SimpleDescriptorDatabase>& db :
         databases_per_descriptor_set) {
      raw_databases_per_descriptor_set.push_back(db.get());
    }
    descriptor_set_in_database.reset(
        new MergedDescriptorDatabase(raw_databases_per_descriptor_set));
  }

  if (proto_path_.empty()) {
    // If there are no --proto_path flags, then just look in the specified
    // --descriptor_set_in files.  But first, verify that the input files are
    // there.
    if (!VerifyInputFilesInDescriptors(descriptor_set_in_database.get())) {
      return 1;
    }

    error_collector.reset(new ErrorPrinter(error_format_));
    descriptor_pool.reset(new DescriptorPool(descriptor_set_in_database.get(),
                                             error_collector.get()));
  } else {
    disk_source_tree.reset(new DiskSourceTree());
    if (!InitializeDiskSourceTree(disk_source_tree.get(),
                                  descriptor_set_in_database.get())) {
      return 1;
    }

    error_collector.reset(
        new ErrorPrinter(error_format_, disk_source_tree.get()));

    source_tree_database.reset(new SourceTreeDescriptorDatabase(
        disk_source_tree.get(), descriptor_set_in_database.get()));
    source_tree_database->RecordErrorsTo(error_collector.get());

    descriptor_pool.reset(new DescriptorPool(
        source_tree_database.get(),
        source_tree_database->GetValidationErrorCollector()));
  }

  descriptor_pool->EnforceWeakDependencies(true);
  if (!ParseInputFiles(descriptor_pool.get(), disk_source_tree.get(),
                       &parsed_files)) {
    return 1;
  }


  // We construct a separate GeneratorContext for each output location.  Note
  // that two code generators may output to the same location, in which case
  // they should share a single GeneratorContext so that OpenForInsert() works.
  GeneratorContextMap output_directories;

  // Generate output.
  if (mode_ == MODE_COMPILE) {
    for (int i = 0; i < output_directives_.size(); i++) {
      std::string output_location = output_directives_[i].output_location;
      if (!HasSuffixString(output_location, ".zip") &&
          !HasSuffixString(output_location, ".jar") &&
          !HasSuffixString(output_location, ".srcjar")) {
        AddTrailingSlash(&output_location);
      }

      auto& generator = output_directories[output_location];

      if (!generator) {
        // First time we've seen this output location.
        generator.reset(new GeneratorContextImpl(parsed_files));
      }

      if (!GenerateOutput(parsed_files, output_directives_[i],
                          generator.get())) {
        return 1;
      }
    }
  }

  // Write all output to disk.
  for (const auto& pair : output_directories) {
    const std::string& location = pair.first;
    GeneratorContextImpl* directory = pair.second.get();
    if (HasSuffixString(location, "/")) {
      if (!directory->WriteAllToDisk(location)) {
        return 1;
      }
    } else {
      if (HasSuffixString(location, ".jar")) {
        directory->AddJarManifest();
      }

      if (!directory->WriteAllToZip(location)) {
        return 1;
      }
    }
  }

  if (!dependency_out_name_.empty()) {
    GOOGLE_DCHECK(disk_source_tree.get());
    if (!GenerateDependencyManifestFile(parsed_files, output_directories,
                                        disk_source_tree.get())) {
      return 1;
    }
  }

  if (!descriptor_set_out_name_.empty()) {
    if (!WriteDescriptorSet(parsed_files)) {
      return 1;
    }
  }

  if (mode_ == MODE_ENCODE || mode_ == MODE_DECODE) {
    if (codec_type_.empty()) {
      // HACK:  Define an EmptyMessage type to use for decoding.
      DescriptorPool pool;
      FileDescriptorProto file;
      file.set_name("empty_message.proto");
      file.add_message_type()->set_name("EmptyMessage");
      GOOGLE_CHECK(pool.BuildFile(file) != NULL);
      codec_type_ = "EmptyMessage";
      if (!EncodeOrDecode(&pool)) {
        return 1;
      }
    } else {
      if (!EncodeOrDecode(descriptor_pool.get())) {
        return 1;
      }
    }
  }

  if (error_collector->FoundErrors() ||
      (fatal_warnings_ && error_collector->FoundWarnings())) {
    return 1;
  }

  if (mode_ == MODE_PRINT) {
    switch (print_mode_) {
      case PRINT_FREE_FIELDS:
        for (int i = 0; i < parsed_files.size(); ++i) {
          const FileDescriptor* fd = parsed_files[i];
          for (int j = 0; j < fd->message_type_count(); ++j) {
            PrintFreeFieldNumbers(fd->message_type(j));
          }
        }
        break;
      case PRINT_NONE:
        GOOGLE_LOG(ERROR) << "If the code reaches here, it usually means a bug of "
                      "flag parsing in the CommandLineInterface.";
        return 1;

        // Do not add a default case.
    }
  }

  return 0;
}